

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue JS_ToNumberHintFree(JSContext *ctx,JSValue val,JSToNumberHintEnum flag)

{
  JSValue JVar1;
  JSValue JVar2;
  int iVar3;
  JSValueUnion pc;
  uint uVar4;
  JSValue v;
  char *p;
  size_t len;
  JSValueUnion local_38;
  size_t local_30;
  
  do {
    local_38 = val.u;
    uVar4 = (uint)val.tag;
    if (uVar4 != 0xffffffff) {
      switch(uVar4) {
      case 0:
      case 6:
      case 7:
        goto switchD_00137b34_caseD_0;
      case 1:
      case 2:
        JVar2.tag = 0;
        JVar2.u.ptr = (void *)((ulong)local_38.ptr & 0xffffffff);
        return JVar2;
      case 3:
        val.tag = 7;
        val.u.float64 = NAN;
        goto switchD_00137b34_caseD_0;
      case 0xfffffff8:
        if ((0xfffffff4 < uVar4) &&
           (iVar3 = *local_38.ptr, *(int *)local_38.ptr = iVar3 + -1, iVar3 < 2)) {
          __JS_FreeValueRT(ctx->rt,val);
        }
        JS_ThrowTypeError(ctx,"cannot convert symbol to number");
        return (JSValue)(ZEXT816(6) << 0x40);
      case 0xfffffff9:
        pc.ptr = JS_ToCStringLen2(ctx,&local_30,val,0);
        if ((0xfffffff4 < uVar4) &&
           (iVar3 = *local_38.ptr, *(int *)local_38.ptr = iVar3 + -1, iVar3 < 2)) {
          __JS_FreeValueRT(ctx->rt,val);
        }
        if ((char *)pc.ptr != (char *)0x0) {
          local_38.ptr = pc.ptr;
          iVar3 = skip_spaces((char *)pc.ptr);
          local_38.float64 = local_38.float64 + (long)iVar3;
          if ((long)local_38.ptr - (long)pc == local_30) {
            v = (JSValue)ZEXT816(0);
          }
          else {
            v = js_atof(ctx,(char *)local_38.ptr,(char **)&local_38.ptr,0,4);
            if ((int)v.tag != 6) {
              iVar3 = skip_spaces((char *)local_38.ptr);
              local_38.float64 = local_38.float64 + (long)iVar3;
              if ((long)local_38.ptr - (long)pc != local_30) {
                JS_FreeValue(ctx,v);
                v.tag = 7;
                v.u.float64 = NAN;
              }
            }
          }
          JS_FreeCString(ctx,(char *)pc.ptr);
          return v;
        }
        break;
      default:
        if ((0xfffffff4 < uVar4) &&
           (iVar3 = *local_38.ptr, *(int *)local_38.ptr = iVar3 + -1, iVar3 < 2)) {
          __JS_FreeValueRT(ctx->rt,val);
        }
        JVar1.tag = 7;
        JVar1.u.float64 = NAN;
        return JVar1;
      }
      break;
    }
    val = JS_ToPrimitiveFree(ctx,val,1);
  } while ((int)val.tag != 6);
  val = (JSValue)(ZEXT816(6) << 0x40);
switchD_00137b34_caseD_0:
  return val;
}

Assistant:

static JSValue JS_ToNumberHintFree(JSContext *ctx, JSValue val,
                                   JSToNumberHintEnum flag)
{
    uint32_t tag;
    JSValue ret;

 redo:
    tag = JS_VALUE_GET_NORM_TAG(val);
    switch(tag) {
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_DECIMAL:
        if (flag != TON_FLAG_NUMERIC) {
            JS_FreeValue(ctx, val);
            return JS_ThrowTypeError(ctx, "cannot convert bigdecimal to number");
        }
        ret = val;
        break;
    case JS_TAG_BIG_INT:
        if (flag != TON_FLAG_NUMERIC) {
            JS_FreeValue(ctx, val);
            return JS_ThrowTypeError(ctx, "cannot convert bigint to number");
        }
        ret = val;
        break;
    case JS_TAG_BIG_FLOAT:
        if (flag != TON_FLAG_NUMERIC) {
            JS_FreeValue(ctx, val);
            return JS_ThrowTypeError(ctx, "cannot convert bigfloat to number");
        }
        ret = val;
        break;
#endif
    case JS_TAG_FLOAT64:
    case JS_TAG_INT:
    case JS_TAG_EXCEPTION:
        ret = val;
        break;
    case JS_TAG_BOOL:
    case JS_TAG_NULL:
        ret = JS_NewInt32(ctx, JS_VALUE_GET_INT(val));
        break;
    case JS_TAG_UNDEFINED:
        ret = JS_NAN;
        break;
    case JS_TAG_OBJECT:
        val = JS_ToPrimitiveFree(ctx, val, HINT_NUMBER);
        if (JS_IsException(val))
            return JS_EXCEPTION;
        goto redo;
    case JS_TAG_STRING:
        {
            const char *str;
            const char *p;
            size_t len;
            
            str = JS_ToCStringLen(ctx, &len, val);
            JS_FreeValue(ctx, val);
            if (!str)
                return JS_EXCEPTION;
            p = str;
            p += skip_spaces(p);
            if ((p - str) == len) {
                ret = JS_NewInt32(ctx, 0);
            } else {
                int flags = ATOD_ACCEPT_BIN_OCT;
                ret = js_atof(ctx, p, &p, 0, flags);
                if (!JS_IsException(ret)) {
                    p += skip_spaces(p);
                    if ((p - str) != len) {
                        JS_FreeValue(ctx, ret);
                        ret = JS_NAN;
                    }
                }
            }
            JS_FreeCString(ctx, str);
        }
        break;
    case JS_TAG_SYMBOL:
        JS_FreeValue(ctx, val);
        return JS_ThrowTypeError(ctx, "cannot convert symbol to number");
    default:
        JS_FreeValue(ctx, val);
        ret = JS_NAN;
        break;
    }
    return ret;
}